

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType1.cpp
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::GridDataType1::GridDataType1(GridDataType1 *this)

{
  GridData::GridData(&this->super_GridData);
  (this->super_GridData).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__GridDataType1_0021a040;
  *(undefined8 *)&(this->super_GridData).field_0xc = 0;
  this->m_ui16NumValues = 0;
  (this->m_vui16Values).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vui16Values).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_vui16Values).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
           ._M_impl.super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->m_vui16Values).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 0;
  (this->super_GridData).m_ui16DtRep = 1;
  return;
}

Assistant:

GridDataType1::GridDataType1() :
    m_f32FieldScale( 0 ),
    m_f32FieldOffset( 0 ),
    m_ui16NumValues( 0 ),
    m_ui16Padding( 0 )
{
    m_ui16DtRep = Type1;
}